

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

sqlite3_int64 fts5ApiRowid(Fts5Context *pCtx)

{
  sqlite3_int64 *psVar1;
  
  if (*(long *)(pCtx + 0x48) == 0) {
    psVar1 = (sqlite3_int64 *)(*(long *)(*(long *)(pCtx + 0x40) + 0x10) + 0x18);
  }
  else {
    psVar1 = (sqlite3_int64 *)(*(long *)(pCtx + 0x48) + 8);
  }
  return *psVar1;
}

Assistant:

static i64 fts5CursorRowid(Fts5Cursor *pCsr){
  assert( pCsr->ePlan==FTS5_PLAN_MATCH 
       || pCsr->ePlan==FTS5_PLAN_SORTED_MATCH 
       || pCsr->ePlan==FTS5_PLAN_SOURCE 
  );
  if( pCsr->pSorter ){
    return pCsr->pSorter->iRowid;
  }else{
    return sqlite3Fts5ExprRowid(pCsr->pExpr);
  }
}